

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

bool cfd::core::TaprootUtil::VerifyTaprootCommitment
               (bool has_parity,uint8_t tapleaf_bit,SchnorrPubkey *target_taproot,
               SchnorrPubkey *internal_pubkey,
               vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes,
               Script *tapscript,ByteData256 *tapleaf_hash)

{
  pointer pBVar1;
  bool bVar2;
  ByteData256 *node;
  pointer commitment;
  ByteData256 hash;
  TaprootScriptTree tree;
  
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)(nodes->
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(nodes->
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  if (hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start < (pointer)0x81) {
    TaprootScriptTree::TaprootScriptTree(&tree,tapleaf_bit,tapscript);
    if (tapleaf_hash != (ByteData256 *)0x0) {
      TapBranch::GetBaseHash(&hash,&tree.super_TapBranch);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&tapleaf_hash->data_,&hash);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
    }
    pBVar1 = (nodes->
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (commitment = (nodes->
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      )._M_impl.super__Vector_impl_data._M_start; commitment != pBVar1;
        commitment = commitment + 1) {
      TaprootScriptTree::AddBranch(&tree,commitment);
    }
    TapBranch::GetTapTweak(&hash,&tree.super_TapBranch,internal_pubkey);
    bVar2 = SchnorrPubkey::IsTweaked(target_taproot,internal_pubkey,&hash,has_parity);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
    TaprootScriptTree::~TaprootScriptTree(&tree);
  }
  else {
    tree.super_TapBranch._vptr_TapBranch = (_func_int **)0x4b4b3f;
    tree.super_TapBranch.has_leaf_ = true;
    tree.super_TapBranch.leaf_version_ = '\x02';
    tree.super_TapBranch._10_2_ = 0;
    tree.super_TapBranch.script_._vptr_Script = (_func_int **)anon_var_dwarf_6184d6;
    logger::warn<unsigned_long>
              ((CfdSourceLocation *)&tree,"control node maximum over. [{}]",(unsigned_long *)&hash);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TaprootUtil::VerifyTaprootCommitment(
    bool has_parity, uint8_t tapleaf_bit,
    const SchnorrPubkey& target_taproot,  // witness program
    const SchnorrPubkey& internal_pubkey,
    const std::vector<ByteData256>& nodes, const Script& tapscript,
    ByteData256* tapleaf_hash) {
  if (nodes.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    warn(CFD_LOG_SOURCE, "control node maximum over. [{}]", nodes.size());
    return false;
  }

  // Compute the tapleaf hash.
  TaprootScriptTree tree(tapleaf_bit, tapscript);
  if (tapleaf_hash != nullptr) *tapleaf_hash = tree.GetTapLeafHash();

  // Compute the Merkle root from the leaf and the provided path.
  for (const auto& node : nodes) {
    tree.AddBranch(node);
  }
  // Compute the tweak from the Merkle root and the inner pubkey.
  auto hash = tree.GetTapTweak(internal_pubkey);
  // Verify that the output pubkey matches the tweaked inner pubkey, after correcting for parity. // NOLINT
  return target_taproot.IsTweaked(internal_pubkey, hash, has_parity);
}